

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_set.h
# Opt level: O2

bool __thiscall
spvtools::EnumSet<spvtools::Extension>::contains(EnumSet<spvtools::Extension> *this,Extension value)

{
  pointer pBVar1;
  size_t sVar2;
  bool bVar3;
  
  sVar2 = FindBucketForValue(this,value);
  pBVar1 = (this->buckets_).
           super__Vector_base<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((sVar2 < (ulong)((long)(this->buckets_).
                             super__Vector_base<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar1 >> 4)) &&
     (pBVar1[sVar2].start == (value & ~kSPV_INTEL_kernel_attributes))) {
    bVar3 = (pBVar1[sVar2].data >> ((ulong)value & 0x3f) & 1) != 0;
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool contains(T value) const {
    const size_t index = FindBucketForValue(value);
    if (index >= buckets_.size() ||
        buckets_[index].start != ComputeBucketStart(value)) {
      return false;
    }
    auto& bucket = buckets_[index];
    return bucket.data & ComputeMaskForValue(value);
  }